

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  GCfunc *fn;
  lua_Debug ar;
  int lim;
  int top;
  int level_local;
  char *msg_local;
  lua_State *L1_local;
  lua_State *L_local;
  
  iVar1 = (int)((long)L->top - (long)L->base >> 3);
  ar.i_ci = 0xc;
  if (msg != (char *)0x0) {
    lua_pushfstring(L,"%s\n",msg);
  }
  lua_pushlstring(L,"stack traceback:",0x10);
  lim = level;
  while( true ) {
    iVar2 = lim + 1;
    iVar3 = lua_getstack(L1,lim,(lua_Debug *)&fn);
    if (iVar3 == 0) break;
    if (ar.i_ci < iVar2) {
      iVar2 = lua_getstack(L1,lim + 0xb,(lua_Debug *)&fn);
      if (iVar2 != 0) {
        lua_pushlstring(L,"\n\t...",5);
        lua_getstack(L1,-10,(lua_Debug *)&fn);
        lim = ar.short_src._52_4_ + -10;
      }
      ar.i_ci = 0x7fffffff;
    }
    else {
      lua_getinfo(L1,"Snlf",(lua_Debug *)&fn);
      uVar4 = L1->top[-1].u64 & 0x7fffffffffff;
      L1->top = L1->top + -1;
      if ((*(byte *)(uVar4 + 10) < 2) || (*ar.name != '\0')) {
        lua_pushfstring(L,"\n\t%s:",&ar.linedefined);
      }
      else {
        lua_pushfstring(L,"\n\t[builtin#%d]:",(ulong)*(byte *)(uVar4 + 10));
      }
      if (0 < (int)(uint)ar.source) {
        lua_pushfstring(L,"%d:",(ulong)(uint)ar.source);
      }
      if (*ar.name == '\0') {
        if (*ar.namewhat == 'm') {
          lua_pushlstring(L," in main chunk",0xe);
        }
        else if (*ar.namewhat == 'C') {
          lua_pushfstring(L," at %p",*(undefined8 *)(uVar4 + 0x28));
        }
        else {
          lua_pushfstring(L," in function <%s:%d>",&ar.linedefined,(ulong)(uint)ar.currentline);
        }
      }
      else {
        lua_pushfstring(L," in function \'%s\'",ar._0_8_);
      }
      lim = iVar2;
      if (0xe < (int)((long)L->top - (long)L->base >> 3) - iVar1) {
        lua_concat(L,(int)((long)L->top - (long)L->base >> 3) - iVar1);
      }
    }
  }
  lua_concat(L,(int)((long)L->top - (long)L->base >> 3) - iVar1);
  return;
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1, const char *msg,
				int level)
{
  int top = (int)(L->top - L->base);
  int lim = TRACEBACK_LEVELS1;
  lua_Debug ar;
  if (msg) lua_pushfstring(L, "%s\n", msg);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    GCfunc *fn;
    if (level > lim) {
      if (!lua_getstack(L1, level + TRACEBACK_LEVELS2, &ar)) {
	level--;
      } else {
	lua_pushliteral(L, "\n\t...");
	lua_getstack(L1, -10, &ar);
	level = ar.i_ci - TRACEBACK_LEVELS2;
      }
      lim = 2147483647;
      continue;
    }
    lua_getinfo(L1, "Snlf", &ar);
    fn = funcV(L1->top-1); L1->top--;
    if (isffunc(fn) && !*ar.namewhat)
      lua_pushfstring(L, "\n\t[builtin#%d]:", fn->c.ffid);
    else
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
    if (ar.currentline > 0)
      lua_pushfstring(L, "%d:", ar.currentline);
    if (*ar.namewhat) {
      lua_pushfstring(L, " in function " LUA_QS, ar.name);
    } else {
      if (*ar.what == 'm') {
	lua_pushliteral(L, " in main chunk");
      } else if (*ar.what == 'C') {
	lua_pushfstring(L, " at %p", fn->c.f);
      } else {
	lua_pushfstring(L, " in function <%s:%d>",
			ar.short_src, ar.linedefined);
      }
    }
    if ((int)(L->top - L->base) - top >= 15)
      lua_concat(L, (int)(L->top - L->base) - top);
  }
  lua_concat(L, (int)(L->top - L->base) - top);
}